

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

bool chaiscript::dispatch::detail::
     compare_types_cast<void,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>&,chaiscript::Boxed_Value_const&>
               (_func_void_vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_ptr_Boxed_Value_ptr
                *param_1,Function_Params *params,Type_Conversions_State *t_conversions)

{
  size_t t_i;
  Boxed_Value *pBVar1;
  bad_boxed_cast *anon_var_0;
  size_t local_30;
  size_type i;
  Type_Conversions_State *t_conversions_local;
  Function_Params *params_local;
  _func_void_vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_ptr_Boxed_Value_ptr
  *param_0_local;
  
  local_30 = 1;
  i = (size_type)t_conversions;
  t_conversions_local = (Type_Conversions_State *)params;
  params_local = (Function_Params *)param_1;
  pBVar1 = Function_Params::operator[](params,0);
  boxed_cast<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>&>
            (pBVar1,(Type_Conversions_State *)i);
  t_i = local_30;
  local_30 = local_30 + 1;
  pBVar1 = Function_Params::operator[]((Function_Params *)t_conversions_local,t_i);
  boxed_cast<chaiscript::Boxed_Value_const&>
            ((chaiscript *)&anon_var_0,pBVar1,(Type_Conversions_State *)i);
  Boxed_Value::~Boxed_Value((Boxed_Value *)&anon_var_0);
  return true;
}

Assistant:

bool compare_types_cast(Ret (*)(Params...), const chaiscript::Function_Params &params, const Type_Conversions_State &t_conversions) noexcept {
        try {
          std::vector<Boxed_Value>::size_type i = 0;
          (boxed_cast<Params>(params[i++], &t_conversions), ...);
          return true;
        } catch (const exception::bad_boxed_cast &) {
          return false;
        }
      }